

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O1

int __thiscall pstore::romfs::romfs::chdir(romfs *this,char *__path)

{
  directory *pdVar1;
  error_code *peVar2;
  not_null<const_pstore::romfs::dirent_*> *pnVar3;
  not_null<const_pstore::romfs::directory_*> *pnVar4;
  directory **ppdVar5;
  error_code eVar6;
  error_or<const_pstore::romfs::directory_*> eo;
  undefined1 auStack_68 [16];
  bool local_58;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_50;
  error_or<const_pstore::romfs::directory_*> local_38;
  
  parse_path(&local_50,this,(not_null<const_char_*>)__path,(this->cwd_).ptr_);
  if (local_50.has_error_ == false) {
    pnVar3 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&local_50);
    dirent::opendir((dirent *)auStack_68,(char *)pnVar3->ptr_);
  }
  else {
    eVar6 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_50);
    local_58 = true;
    peVar2 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
             error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                       ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                        auStack_68);
    peVar2->_M_value = eVar6._M_value;
    peVar2->_M_cat = eVar6._M_cat;
  }
  if (local_58 == false) {
    pnVar4 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                       ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                        auStack_68);
    pdVar1 = pnVar4->ptr_;
    (this->cwd_).ptr_ = pdVar1;
    pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&this->cwd_);
    local_38.has_error_ = false;
    ppdVar5 = error_or<pstore::romfs::directory_const*>::
              value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
                        (&local_38);
    *ppdVar5 = pdVar1;
  }
  else {
    eVar6 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error
                      ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                       auStack_68);
    local_38.has_error_ = true;
    peVar2 = error_or<pstore::romfs::directory_const*>::
             error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
                       (&local_38);
    peVar2->_M_value = eVar6._M_value;
    peVar2->_M_cat = eVar6._M_cat;
  }
  if (local_58 == false) {
    error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
              ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)auStack_68);
  }
  else {
    error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
              ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)auStack_68);
  }
  if (local_50.has_error_ == false) {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
              (&local_50);
  }
  else {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
              (&local_50);
  }
  eVar6 = error_or<const_pstore::romfs::directory_*>::get_error(&local_38);
  if (local_38.has_error_ == false) {
    error_or<pstore::romfs::directory_const*>::
    value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
              (&local_38);
  }
  else {
    error_or<pstore::romfs::directory_const*>::
    error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
              (&local_38);
  }
  return eVar6._M_value;
}

Assistant:

std::error_code romfs::chdir (not_null<czstring> const path) {
            auto const dirent_to_directory = [] (dirent_ptr const de) { return de->opendir (); };

            auto const set_cwd = [this] (directory const * const d) {
                cwd_ = d; // Warning: side-effect!
                return error_or<directory const *> (d);
            };

            auto const eo = (this->parse_path (path) >>= dirent_to_directory) >>= set_cwd;
            return eo.get_error ();
        }